

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd_ext_to_khr.cpp
# Opt level: O0

bool spvtools::opt::(anonymous_namespace)::
     ReplaceTrinaryMid<(GLSLstd450)38,(GLSLstd450)41,(GLSLstd450)44>
               (IRContext *ctx,Instruction *inst,
               vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               *param_3)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  initializer_list<unsigned_int> init_list_02;
  initializer_list<unsigned_int> init_list_03;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  uint32_t uVar1;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *insert_before;
  Analysis preserved_analyses;
  uint32_t uVar2;
  FeatureManager *pFVar3;
  Instruction *pIVar4;
  uint32_t local_344;
  iterator local_340;
  undefined8 local_338;
  SmallVector<unsigned_int,_2UL> local_330;
  Operand local_308;
  uint32_t local_2d4;
  iterator local_2d0;
  undefined8 local_2c8;
  SmallVector<unsigned_int,_2UL> local_2c0;
  Operand local_298;
  uint32_t local_264;
  iterator local_260;
  undefined8 local_258;
  SmallVector<unsigned_int,_2UL> local_250;
  Operand local_228;
  uint local_1f4;
  iterator local_1f0;
  undefined8 local_1e8;
  SmallVector<unsigned_int,_2UL> local_1e0;
  Operand local_1b8;
  uint32_t local_184;
  iterator local_180;
  undefined8 local_178;
  SmallVector<unsigned_int,_2UL> local_170;
  Operand local_148;
  undefined1 local_118 [8];
  OperandList new_operands;
  uint32_t local_f8;
  uint32_t local_f4;
  iterator local_f0;
  size_type local_e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_e0;
  Instruction *local_c8;
  Instruction *max;
  uint32_t local_b8;
  uint32_t local_b4;
  iterator local_b0;
  size_type local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_a0;
  Instruction *local_88;
  Instruction *min;
  uint32_t local_78;
  uint32_t op3;
  uint32_t op2;
  uint32_t op1;
  InstructionBuilder ir_builder;
  string local_48;
  uint32_t local_24;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *pvStack_20;
  uint32_t glsl405_ext_inst_id;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *param_2_local;
  Instruction *inst_local;
  IRContext *ctx_local;
  
  pvStack_20 = param_3;
  param_2_local =
       (vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
        *)inst;
  inst_local = (Instruction *)ctx;
  pFVar3 = IRContext::get_feature_mgr(ctx);
  local_24 = FeatureManager::GetExtInstImportId_GLSLstd450(pFVar3);
  pIVar4 = inst_local;
  if (local_24 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_48,"GLSL.std.450",(allocator<char> *)&ir_builder.field_0x1f);
    IRContext::AddExtInstImport((IRContext *)pIVar4,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&ir_builder.field_0x1f);
    pFVar3 = IRContext::get_feature_mgr((IRContext *)inst_local);
    local_24 = FeatureManager::GetExtInstImportId_GLSLstd450(pFVar3);
  }
  pIVar4 = inst_local;
  insert_before = param_2_local;
  preserved_analyses = opt::operator|(kAnalysisBegin,kAnalysisInstrToBlockMapping);
  InstructionBuilder::InstructionBuilder
            ((InstructionBuilder *)&op2,(IRContext *)pIVar4,(Instruction *)insert_before,
             preserved_analyses);
  op3 = opt::Instruction::GetSingleWordInOperand((Instruction *)param_2_local,2);
  local_78 = opt::Instruction::GetSingleWordInOperand((Instruction *)param_2_local,3);
  min._4_4_ = opt::Instruction::GetSingleWordInOperand((Instruction *)param_2_local,4);
  uVar2 = opt::Instruction::type_id((Instruction *)param_2_local);
  uVar1 = local_24;
  local_b8 = local_78;
  local_b4 = min._4_4_;
  local_b0 = &local_b8;
  local_a8 = 2;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&max + 7));
  __l_00._M_len = local_a8;
  __l_00._M_array = local_b0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_a0,__l_00,(allocator_type *)((long)&max + 7));
  pIVar4 = InstructionBuilder::AddNaryExtendedInstruction
                     ((InstructionBuilder *)&op2,uVar2,uVar1,0x26,&local_a0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_a0);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&max + 7));
  local_88 = pIVar4;
  uVar2 = opt::Instruction::type_id((Instruction *)param_2_local);
  uVar1 = local_24;
  local_f8 = local_78;
  local_f4 = min._4_4_;
  local_f0 = &local_f8;
  local_e8 = 2;
  std::allocator<unsigned_int>::allocator
            ((allocator<unsigned_int> *)
             ((long)&new_operands.
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  __l._M_len = local_e8;
  __l._M_array = local_f0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_e0,__l,
             (allocator_type *)
             ((long)&new_operands.
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pIVar4 = InstructionBuilder::AddNaryExtendedInstruction
                     ((InstructionBuilder *)&op2,uVar2,uVar1,0x29,&local_e0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_e0);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&new_operands.
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  local_c8 = pIVar4;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_118);
  local_184 = local_24;
  local_180 = &local_184;
  local_178 = 1;
  init_list_03._M_len = 1;
  init_list_03._M_array = local_180;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_170,init_list_03);
  Operand::Operand(&local_148,SPV_OPERAND_TYPE_ID,&local_170);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_118,
             &local_148);
  Operand::~Operand(&local_148);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_170);
  local_1f4 = 0x2c;
  local_1f0 = &local_1f4;
  local_1e8 = 1;
  init_list_02._M_len = 1;
  init_list_02._M_array = local_1f0;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_1e0,init_list_02);
  Operand::Operand(&local_1b8,SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER,&local_1e0);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_118,
             &local_1b8);
  Operand::~Operand(&local_1b8);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_1e0);
  local_264 = op3;
  local_260 = &local_264;
  local_258 = 1;
  init_list_01._M_len = 1;
  init_list_01._M_array = local_260;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_250,init_list_01);
  Operand::Operand(&local_228,SPV_OPERAND_TYPE_ID,&local_250);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_118,
             &local_228);
  Operand::~Operand(&local_228);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_250);
  local_2d4 = opt::Instruction::result_id(local_88);
  local_2d0 = &local_2d4;
  local_2c8 = 1;
  init_list_00._M_len = 1;
  init_list_00._M_array = local_2d0;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_2c0,init_list_00);
  Operand::Operand(&local_298,SPV_OPERAND_TYPE_ID,&local_2c0);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_118,
             &local_298);
  Operand::~Operand(&local_298);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_2c0);
  local_344 = opt::Instruction::result_id(local_c8);
  local_340 = &local_344;
  local_338 = 1;
  init_list._M_len = 1;
  init_list._M_array = local_340;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_330,init_list);
  Operand::Operand(&local_308,SPV_OPERAND_TYPE_ID,&local_330);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_118,
             &local_308);
  Operand::~Operand(&local_308);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_330);
  opt::Instruction::SetInOperands((Instruction *)param_2_local,(OperandList *)local_118);
  IRContext::UpdateDefUse((IRContext *)inst_local,(Instruction *)param_2_local);
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)local_118);
  return true;
}

Assistant:

bool ReplaceTrinaryMid(IRContext* ctx, Instruction* inst,
                       const std::vector<const analysis::Constant*>&) {
  uint32_t glsl405_ext_inst_id =
      ctx->get_feature_mgr()->GetExtInstImportId_GLSLstd450();
  if (glsl405_ext_inst_id == 0) {
    ctx->AddExtInstImport("GLSL.std.450");
    glsl405_ext_inst_id =
        ctx->get_feature_mgr()->GetExtInstImportId_GLSLstd450();
  }

  InstructionBuilder ir_builder(
      ctx, inst,
      IRContext::kAnalysisDefUse | IRContext::kAnalysisInstrToBlockMapping);

  uint32_t op1 = inst->GetSingleWordInOperand(2);
  uint32_t op2 = inst->GetSingleWordInOperand(3);
  uint32_t op3 = inst->GetSingleWordInOperand(4);

  Instruction* min = ir_builder.AddNaryExtendedInstruction(
      inst->type_id(), glsl405_ext_inst_id, static_cast<uint32_t>(min_opcode),
      {op2, op3});
  Instruction* max = ir_builder.AddNaryExtendedInstruction(
      inst->type_id(), glsl405_ext_inst_id, static_cast<uint32_t>(max_opcode),
      {op2, op3});

  Instruction::OperandList new_operands;
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {glsl405_ext_inst_id}});
  new_operands.push_back({SPV_OPERAND_TYPE_EXTENSION_INSTRUCTION_NUMBER,
                          {static_cast<uint32_t>(clamp_opcode)}});
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {op1}});
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {min->result_id()}});
  new_operands.push_back({SPV_OPERAND_TYPE_ID, {max->result_id()}});

  inst->SetInOperands(std::move(new_operands));
  ctx->UpdateDefUse(inst);
  return true;
}